

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

void skipblock(int level,char start,char end)

{
  undefined4 uVar1;
  char cVar2;
  undefined1 in_DL;
  undefined1 in_SIL;
  undefined4 in_EDI;
  bool bVar3;
  char c;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)CONCAT51(CONCAT41(in_EDI,in_SIL),in_DL) << 0x10;
  do {
    while( true ) {
      cVar2 = getchr();
      if (cVar2 == '\0') {
        return;
      }
      bVar3 = cVar2 != uStack_8._3_1_;
      uVar1 = (undefined4)uStack_8;
      if (bVar3) break;
      uStack_8 = CONCAT44(uStack_8._4_4_ + 1,(undefined4)uStack_8);
    }
  } while ((cVar2 != uStack_8._2_1_) ||
          (uStack_8._4_4_ = uStack_8._4_4_ + -1, uStack_8 = CONCAT44(uStack_8._4_4_,uVar1),
          0 < uStack_8._4_4_));
  return;
}

Assistant:

void skipblock(int level,char start,char end)
/* skips a block between the two specified start- and end-characters */
{
  char c;

  while (c = getchr()) {
    if (c == start) {
      ++level;
    }
    else if (c == end) {
      if (--level <= 0)
        break;
    }
  }
}